

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringMappedVector.hpp
# Opt level: O0

optional<unsigned_long> __thiscall
gmlc::containers::
StringMappedVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,(reference_stability)0,5>
::insert<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
          (StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>
           *this,string_view searchValue,
          unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *data)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  this_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *in_RDI;
  optional<unsigned_long> oVar3;
  size_t index;
  iterator fnd;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffff88;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *in_stack_ffffffffffffff90;
  StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
  *this_01;
  unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
  *in_stack_ffffffffffffffa0;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb8;
  _Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
  local_38 [5];
  _Storage<unsigned_long,_true> local_10;
  undefined1 local_8;
  
  local_38[0]._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x3dbd80);
  this_00._M_cur =
       (__node_type *)
       std::
       unordered_map<std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long,_std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::__detail::operator==
                    (local_38,(_Node_iterator_base<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_unsigned_long>,_true>
                               *)&stack0xffffffffffffffc0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    StableBlockVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_5U,_std::allocator<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>_>_>
    ::size(in_RDI);
    StableBlockVector<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>,5u,std::allocator<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>>
    ::emplace_back<std::unique_ptr<helics::Filter,std::default_delete<helics::Filter>>>
              (in_stack_ffffffffffffff90,
               (unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_> *)
               in_stack_ffffffffffffff88);
    StableBlockVector<std::__cxx11::string,5u,std::allocator<std::__cxx11::string>>::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
              ((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this_00._M_cur,in_stack_ffffffffffffffb8);
    this_01 = in_RDI + 2;
    StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::back((StableBlockVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_5U,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(in_RDI + 1));
    std::
    unordered_map<std::basic_string_view<char,std::char_traits<char>>,unsigned_long,std::hash<std::basic_string_view<char,std::char_traits<char>>>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,unsigned_long>>>
    ::emplace<std::__cxx11::string&,unsigned_long&>
              (in_stack_ffffffffffffffa0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI,
               &this_01->csize);
    std::optional<unsigned_long>::optional<unsigned_long,_true>
              ((optional<unsigned_long> *)this_01,(unsigned_long *)in_stack_ffffffffffffff88);
    uVar2 = extraout_RDX_00;
  }
  else {
    std::optional<unsigned_long>::optional((optional<unsigned_long> *)&local_10);
    uVar2 = extraout_RDX;
  }
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._9_7_ = (undefined7)((ulong)uVar2 >> 8);
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged = (bool)local_8;
  oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_10._M_value;
  return (optional<unsigned_long>)
         oVar3.super__Optional_base<unsigned_long,_true,_true>._M_payload.
         super__Optional_payload_base<unsigned_long>;
}

Assistant:

std::optional<size_t> insert(std::string_view searchValue, Us&&... data)
        {
            auto fnd = lookup.find(searchValue);
            if (fnd != lookup.end()) {
                return std::nullopt;
            }
            auto index = dataStorage.size();
            dataStorage.emplace_back(std::forward<Us>(data)...);
            names.emplace_back(searchValue);
            lookup.emplace(names.back(), index);
            return index;
        }